

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O0

bool testing::Mock::VerifyAndClear(void *mock_obj)

{
  bool bVar1;
  GTestMutexLock local_18;
  MutexLock l;
  void *mock_obj_local;
  
  l.mutex_ = (MutexBase *)mock_obj;
  internal::GTestMutexLock::GTestMutexLock(&local_18,(MutexBase *)internal::g_gmock_mutex);
  ClearDefaultActionsLocked(l.mutex_);
  bVar1 = VerifyAndClearExpectationsLocked(l.mutex_);
  internal::GTestMutexLock::~GTestMutexLock(&local_18);
  return bVar1;
}

Assistant:

GTEST_LOCK_EXCLUDED_(internal::g_gmock_mutex) {
  internal::MutexLock l(&internal::g_gmock_mutex);
  ClearDefaultActionsLocked(mock_obj);
  return VerifyAndClearExpectationsLocked(mock_obj);
}